

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_expectNoCallDoesntInfluenceExpectOneCall_TestShell::
TEST_MockCallTest_expectNoCallDoesntInfluenceExpectOneCall_TestShell
          (TEST_MockCallTest_expectNoCallDoesntInfluenceExpectOneCall_TestShell *this)

{
  TEST_MockCallTest_expectNoCallDoesntInfluenceExpectOneCall_TestShell *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)
       &PTR__TEST_MockCallTest_expectNoCallDoesntInfluenceExpectOneCall_TestShell_003563d0;
  return;
}

Assistant:

TEST(MockCallTest, expectNoCallDoesntInfluenceExpectOneCall)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction(0, "lazy");
    expectations.addFunction("influence")->callWasMade(1);
    MockUnexpectedCallHappenedFailure expectedFailure(mockFailureTest(), "lazy", expectations);

    mock().expectNoCall("lazy");
    mock().expectOneCall("influence");
    mock().actualCall("influence");
    mock().actualCall("lazy");

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}